

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minigzip.c
# Opt level: O1

void file_uncompress(char *file)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  gzFile pgVar4;
  FILE *pFVar5;
  char *pcVar6;
  char *in_RSI;
  char *pcVar7;
  gzFile unaff_R12;
  bool bVar8;
  uint uVar9;
  ulong uVar10;
  char *pcVar11;
  char *__s1;
  bool bVar12;
  char buf [1024];
  undefined4 uStack_470;
  undefined1 uStack_46c;
  char *pcStack_458;
  gzFile pgStack_450;
  char acStack_428 [1032];
  
  pcVar11 = acStack_428;
  sVar3 = strlen(file);
  if (sVar3 - 0x3fd < 0xfffffffffffffc00) {
    file_uncompress_cold_3();
LAB_001017ee:
    pgVar4 = unaff_R12;
    file_uncompress_cold_2();
  }
  else {
    unaff_R12 = (gzFile)0x400;
    snprintf(acStack_428,0x400,"%s",file);
    if ((sVar3 < 4) || (iVar1 = strcmp(file + (sVar3 - 3),".gz"), iVar1 != 0)) {
      unaff_R12 = (gzFile)(0x400 - sVar3);
      snprintf(acStack_428 + sVar3,(size_t)unaff_R12,"%s",".gz");
      pcVar7 = acStack_428;
      pcVar11 = file;
    }
    else {
      acStack_428[sVar3 - 3] = '\0';
      pcVar7 = file;
    }
    in_RSI = "rb";
    pgVar4 = (gzFile)gzopen64(pcVar7);
    if (pgVar4 == (gzFile)0x0) goto LAB_001017ee;
    in_RSI = "wb";
    pFVar5 = fopen64(pcVar11,"wb");
    if (pFVar5 != (FILE *)0x0) {
      gz_uncompress(pgVar4,(FILE *)pFVar5);
      unlink(pcVar7);
      return;
    }
  }
  pcVar7 = file;
  file_uncompress_cold_1();
  uVar10 = (ulong)pcVar7 & 0xffffffff;
  uStack_46c = 0;
  uStack_470 = 0x20366277;
  prog = *(char **)in_RSI;
  pcVar11 = *(char **)in_RSI;
  pcStack_458 = file;
  pgStack_450 = pgVar4;
  pcVar6 = strrchr(pcVar11,0x2f);
  __s1 = pcVar6 + 1;
  if (pcVar6 == (char *)0x0) {
    __s1 = pcVar11;
  }
  iVar1 = strcmp(__s1,"gunzip");
  if (iVar1 == 0) {
    bVar12 = true;
    bVar8 = false;
  }
  else {
    iVar1 = strcmp(__s1,"zcat");
    bVar12 = iVar1 == 0;
    bVar8 = bVar12;
  }
  in_RSI = in_RSI + 8;
  iVar1 = (int)pcVar7 + -1;
  if (1 < (int)pcVar7) {
    do {
      pcVar11 = *(char **)in_RSI;
      iVar2 = strcmp(pcVar11,"-c");
      if (iVar2 == 0) {
        bVar8 = true;
      }
      else {
        iVar2 = strcmp(pcVar11,"-d");
        if (iVar2 == 0) {
          bVar12 = true;
        }
        else {
          iVar2 = strcmp(pcVar11,"-f");
          if (iVar2 == 0) {
            uStack_470 = CONCAT13(0x66,(undefined3)uStack_470);
          }
          else {
            iVar2 = strcmp(pcVar11,"-h");
            if (iVar2 == 0) {
              uStack_470 = CONCAT13(0x68,(undefined3)uStack_470);
            }
            else {
              iVar2 = strcmp(pcVar11,"-r");
              if (iVar2 == 0) {
                uStack_470 = CONCAT13(0x52,(undefined3)uStack_470);
              }
              else {
                if (*pcVar11 != '-') {
                  iVar1 = (int)uVar10 + -1;
                  goto LAB_0010195b;
                }
                if ((8 < (byte)(pcVar11[1] - 0x31U)) || (pcVar11[2] != '\0')) goto LAB_0010195b;
                uStack_470._0_3_ = CONCAT12(pcVar11[1],(undefined2)uStack_470);
              }
            }
          }
        }
      }
      in_RSI = in_RSI + 8;
      iVar1 = iVar1 + -1;
      uVar9 = (int)uVar10 - 1;
      uVar10 = (ulong)uVar9;
    } while (1 < (int)uVar9);
    iVar1 = 0;
  }
LAB_0010195b:
  if (uStack_470._3_1_ == ' ') {
    uStack_470 = uStack_470 & 0xffffff;
  }
  if (iVar1 == 0) {
    if (bVar12) {
      iVar1 = fileno(_stdin);
      pgVar4 = (gzFile)gzdopen(iVar1,"rb");
      if (pgVar4 == (gzFile)0x0) {
LAB_00101aba:
        main_cold_3();
LAB_00101abf:
        main_cold_4();
        return;
      }
      gz_uncompress(pgVar4,(FILE *)_stdout);
    }
    else {
      iVar1 = fileno(_stdout);
      pgVar4 = (gzFile)gzdopen(iVar1,&uStack_470);
      if (pgVar4 == (gzFile)0x0) goto LAB_00101abf;
      gz_compress((FILE *)_stdin,pgVar4);
    }
  }
  else {
    do {
      pcVar11 = *(char **)in_RSI;
      if (bVar12) {
        if (bVar8) {
          pgVar4 = (gzFile)gzopen64(pcVar11,"rb");
          if (pgVar4 == (gzFile)0x0) {
            main_cold_1();
          }
          else {
            gz_uncompress(pgVar4,(FILE *)_stdout);
          }
        }
        else {
          file_uncompress(pcVar11);
        }
      }
      else if (bVar8) {
        pFVar5 = fopen64(pcVar11,"rb");
        if (pFVar5 == (FILE *)0x0) {
          perror(*(char **)in_RSI);
        }
        else {
          iVar2 = fileno(_stdout);
          pgVar4 = (gzFile)gzdopen(iVar2,&uStack_470);
          if (pgVar4 == (gzFile)0x0) {
            main_cold_2();
            goto LAB_00101aba;
          }
          gz_compress((FILE *)pFVar5,pgVar4);
        }
      }
      else {
        file_compress(pcVar11,(char *)&uStack_470);
      }
      in_RSI = in_RSI + 8;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  return;
}

Assistant:

void file_uncompress(file)
    char  *file;
{
    local char buf[MAX_NAME_LEN];
    char *infile, *outfile;
    FILE  *out;
    gzFile in;
    size_t len = strlen(file);

    if (len + strlen(GZ_SUFFIX) >= sizeof(buf)) {
        fprintf(stderr, "%s: filename too long\n", prog);
        exit(1);
    }

#if !defined(NO_snprintf) && !defined(NO_vsnprintf)
    snprintf(buf, sizeof(buf), "%s", file);
#else
    strcpy(buf, file);
#endif

    if (len > SUFFIX_LEN && strcmp(file+len-SUFFIX_LEN, GZ_SUFFIX) == 0) {
        infile = file;
        outfile = buf;
        outfile[len-3] = '\0';
    } else {
        outfile = file;
        infile = buf;
#if !defined(NO_snprintf) && !defined(NO_vsnprintf)
        snprintf(buf + len, sizeof(buf) - len, "%s", GZ_SUFFIX);
#else
        strcat(infile, GZ_SUFFIX);
#endif
    }
    in = gzopen(infile, "rb");
    if (in == NULL) {
        fprintf(stderr, "%s: can't gzopen %s\n", prog, infile);
        exit(1);
    }
    out = fopen(outfile, "wb");
    if (out == NULL) {
        perror(file);
        exit(1);
    }

    gz_uncompress(in, out);

    unlink(infile);
}